

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O2

void asmjit::v1_14::EmitterUtils::logInstructionEmitted
               (BaseAssembler *self,InstId instId,InstOptions options,Operand_ *o0,Operand_ *o1,
               Operand_ *o2,Operand_ *opExt,uint32_t relSize,uint32_t immSize,uint8_t *afterCursor)

{
  FormatFlags FVar1;
  Logger *pLVar2;
  byte *pbVar3;
  size_t binSize;
  uint8_t *puVar4;
  ulong uVar5;
  undefined1 *puVar6;
  size_t offsetSize;
  size_t immSize_00;
  char *comment;
  FormatIndentationGroup local_1d8;
  InstOptions local_1d4;
  RegOnly local_1d0;
  undefined8 local_1c8;
  ulong uStack_1c0;
  undefined8 local_1b8;
  undefined1 *local_1b0;
  undefined1 local_1a8 [272];
  Operand_ opArray [6];
  
  pLVar2 = (self->super_BaseEmitter)._logger;
  if (pLVar2 == (Logger *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/emitterutils.cpp"
               ,0x4d,"logger != nullptr");
  }
  local_1b0 = local_1a8;
  uStack_1c0 = 0;
  local_1c8 = 0x20;
  local_1b8 = 0x107;
  local_1a8[0] = 0;
  FVar1 = (pLVar2->_options)._flags;
  puVar4 = self->_bufferPtr;
  opArrayFromEmitArgs(opArray,o0,o1,o2,opExt);
  local_1d8 = kCode;
  pbVar3 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::FormatIndentationGroup>
                     (&(pLVar2->_options)._indentation,&local_1d8);
  String::_opChars((String *)&local_1c8,kAppend,' ',(ulong)*pbVar3);
  local_1d0 = (self->super_BaseEmitter)._extraReg;
  local_1d8 = instId;
  local_1d4 = options;
  (*(self->super_BaseEmitter)._funcs.formatInstruction)
            ((String *)&local_1c8,FVar1,&self->super_BaseEmitter,
             (self->super_BaseEmitter)._environment._arch,(BaseInst *)&local_1d8,opArray,6);
  if ((FVar1 & kMachineCode) == kNone) {
    comment = (self->super_BaseEmitter)._inlineComment;
    binSize = 0xffffffffffffffff;
    puVar4 = (uint8_t *)0x0;
    offsetSize = 0;
    immSize_00 = 0;
  }
  else {
    binSize = (long)afterCursor - (long)puVar4;
    comment = (self->super_BaseEmitter)._inlineComment;
    puVar4 = self->_bufferPtr;
    offsetSize = (size_t)relSize;
    immSize_00 = (size_t)immSize;
  }
  finishFormattedLine((String *)&local_1c8,&pLVar2->_options,puVar4,binSize,offsetSize,immSize_00,
                      comment);
  uVar5 = uStack_1c0;
  puVar6 = local_1b0;
  if ((local_1c8 & 0xff) < 0x1f) {
    uVar5 = local_1c8 & 0xff;
    puVar6 = (undefined1 *)((long)&local_1c8 + 1);
  }
  (*pLVar2->_vptr_Logger[2])(pLVar2,puVar6,uVar5);
  String::reset((String *)&local_1c8);
  return;
}

Assistant:

void logInstructionEmitted(
  BaseAssembler* self,
  InstId instId,
  InstOptions options,
  const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_* opExt,
  uint32_t relSize, uint32_t immSize, uint8_t* afterCursor) {

  Logger* logger = self->logger();
  ASMJIT_ASSERT(logger != nullptr);

  StringTmp<256> sb;
  FormatFlags formatFlags = logger->flags();

  uint8_t* beforeCursor = self->bufferPtr();
  intptr_t emittedSize = (intptr_t)(afterCursor - beforeCursor);

  Operand_ opArray[Globals::kMaxOpCount];
  opArrayFromEmitArgs(opArray, o0, o1, o2, opExt);

  sb.appendChars(' ', logger->indentation(FormatIndentationGroup::kCode));
  self->_funcs.formatInstruction(sb, formatFlags, self, self->arch(), BaseInst(instId, options, self->extraReg()), opArray, Globals::kMaxOpCount);

  if (Support::test(formatFlags, FormatFlags::kMachineCode))
    finishFormattedLine(sb, logger->options(), self->bufferPtr(), size_t(emittedSize), relSize, immSize, self->inlineComment());
  else
    finishFormattedLine(sb, logger->options(), nullptr, SIZE_MAX, 0, 0, self->inlineComment());
  logger->log(sb);
}